

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
wallet::HandleLoadWallet(wallet *this,WalletContext *context,LoadWalletFn load_wallet)

{
  function<void_()> cleanup;
  iterator iVar1;
  function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>
  *in_RDX;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock9;
  undefined8 in_stack_ffffffffffffffa8;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_30,&context->wallets_mutex,
             "context.wallets_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0xd7,false);
  iVar1 = std::__cxx11::
          list<std::function<void(std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>)>,std::allocator<std::function<void(std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>)>>>
          ::
          emplace<std::function<void(std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>)>>
                    ((list<std::function<void(std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>)>,std::allocator<std::function<void(std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>)>>>
                      *)&context->wallet_load_fns,(const_iterator)&context->wallet_load_fns,in_RDX);
  cleanup.super__Function_base._M_functor._8_8_ = context;
  cleanup.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffffa8;
  cleanup.super__Function_base._M_manager = (_Manager_type)iVar1._M_node;
  cleanup._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:217:43)>
       ::_M_manager;
  interfaces::MakeCleanupHandler((interfaces *)this,cleanup);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffb0);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<interfaces::Handler> HandleLoadWallet(WalletContext& context, LoadWalletFn load_wallet)
{
    LOCK(context.wallets_mutex);
    auto it = context.wallet_load_fns.emplace(context.wallet_load_fns.end(), std::move(load_wallet));
    return interfaces::MakeCleanupHandler([&context, it] { LOCK(context.wallets_mutex); context.wallet_load_fns.erase(it); });
}